

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

int png_image_begin_read_from_file(png_imagep image,char *file_name)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *error_message;
  FILE *fp;
  char *file_name_local;
  png_imagep image_local;
  
  if ((image == (png_imagep)0x0) || (image->version != 1)) {
    if (image != (png_imagep)0x0) {
      iVar1 = png_image_error(image,"png_image_begin_read_from_file: incorrect PNG_IMAGE_VERSION");
      return iVar1;
    }
  }
  else {
    if (file_name == (char *)0x0) {
      iVar1 = png_image_error(image,"png_image_begin_read_from_file: invalid argument");
      return iVar1;
    }
    __stream = fopen(file_name,"rb");
    if (__stream == (FILE *)0x0) {
      piVar2 = __errno_location();
      error_message = strerror(*piVar2);
      iVar1 = png_image_error(image,error_message);
      return iVar1;
    }
    iVar1 = png_image_read_init(image);
    if (iVar1 != 0) {
      image->opaque->png_ptr->io_ptr = __stream;
      image->opaque->field_0x28 = image->opaque->field_0x28 & 0xfd | 2;
      iVar1 = png_safe_execute(image,png_image_read_header,image);
      return iVar1;
    }
    fclose(__stream);
  }
  return 0;
}

Assistant:

int PNGAPI
png_image_begin_read_from_file(png_imagep image, const char *file_name)
{
   if (image != NULL && image->version == PNG_IMAGE_VERSION)
   {
      if (file_name != NULL)
      {
         FILE *fp = fopen(file_name, "rb");

         if (fp != NULL)
         {
            if (png_image_read_init(image) != 0)
            {
               image->opaque->png_ptr->io_ptr = fp;
               image->opaque->owned_file = 1;
               return png_safe_execute(image, png_image_read_header, image);
            }

            /* Clean up: just the opened file. */
            (void)fclose(fp);
         }

         else
            return png_image_error(image, strerror(errno));
      }

      else
         return png_image_error(image,
             "png_image_begin_read_from_file: invalid argument");
   }

   else if (image != NULL)
      return png_image_error(image,
          "png_image_begin_read_from_file: incorrect PNG_IMAGE_VERSION");

   return 0;
}